

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inja.hpp
# Opt level: O3

Token * __thiscall inja::Lexer::make_token(Token *__return_storage_ptr__,Lexer *this,Kind kind)

{
  ulong pos;
  ulong uVar1;
  basic_string_view<char,_std::char_traits<char>_> bVar2;
  basic_string_view<char,_std::char_traits<char>_> local_20;
  
  local_20.data_ = (this->m_in).data_;
  local_20.size_ = (this->m_in).size_;
  pos = this->m_tok_start;
  if (local_20.size_ < this->m_tok_start) {
    pos = local_20.size_;
  }
  uVar1 = this->m_pos;
  if (this->m_pos < pos) {
    uVar1 = pos;
  }
  if (local_20.size_ <= uVar1) {
    uVar1 = local_20.size_;
  }
  bVar2 = nonstd::sv_lite::basic_string_view<char,_std::char_traits<char>_>::substr
                    (&local_20,pos,uVar1 - pos);
  __return_storage_ptr__->kind = kind;
  (__return_storage_ptr__->text).data_ = bVar2.data_;
  (__return_storage_ptr__->text).size_ = bVar2.size_;
  return __return_storage_ptr__;
}

Assistant:

Token make_token(Token::Kind kind) const { return Token(kind, string_view::slice(m_in, m_tok_start, m_pos)); }